

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.cc
# Opt level: O2

void __thiscall WorkSpace::WorkSpace(WorkSpace *this,string *filename)

{
  bool bVar1;
  string local_50;
  
  SequenceDistanceGraph::SequenceDistanceGraph(&this->sdg,this);
  memset(&this->paired_reads_datastores,0,0x90);
  std::vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>::reserve
            (&this->linked_reads_datastores,100);
  std::vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>::reserve
            (&this->paired_reads_datastores,100);
  std::vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>::reserve
            (&this->long_reads_datastores,100);
  std::vector<KmerCounter,_std::allocator<KmerCounter>_>::reserve(&this->kmer_counters,100);
  bVar1 = std::operator!=(filename,"");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_50,(string *)filename);
    load_from_disk(this,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

WorkSpace::WorkSpace(const std::string &filename) : sdg(*this) {
    linked_reads_datastores.reserve(MAX_WORKSPACE_VECTOR_SIZE);
    paired_reads_datastores.reserve(MAX_WORKSPACE_VECTOR_SIZE);
    long_reads_datastores.reserve(MAX_WORKSPACE_VECTOR_SIZE);
    kmer_counters.reserve(MAX_WORKSPACE_VECTOR_SIZE);
    if (filename!="") load_from_disk(filename);
}